

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_set_vert_loop_filter_done
               (AV1_COMMON *cm,AV1LfSync *lf_sync,int num_mis_in_lpf_unit_height_log2)

{
  int iVar1;
  int plane_00;
  byte bVar2;
  int in_EDX;
  AV1LfSync *in_RSI;
  long in_RDI;
  int sb_rows;
  int sb_cols;
  int sb_row;
  int plane;
  int sb_cols_00;
  int c;
  
  bVar2 = (byte)in_EDX;
  plane_00 = *(int *)(in_RDI + 0x218) + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f);
  iVar1 = *(int *)(in_RDI + 0x214);
  for (sb_cols_00 = 0; sb_cols_00 < iVar1 + (1 << (bVar2 & 0x1f)) + -1 >> (bVar2 & 0x1f);
      sb_cols_00 = sb_cols_00 + 1) {
    for (c = 0; c < 3; c = c + 1) {
      sync_write(in_RSI,in_EDX,c,sb_cols_00,plane_00);
    }
  }
  return;
}

Assistant:

void av1_set_vert_loop_filter_done(AV1_COMMON *cm, AV1LfSync *lf_sync,
                                   int num_mis_in_lpf_unit_height_log2) {
  int plane, sb_row;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, num_mis_in_lpf_unit_height_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, num_mis_in_lpf_unit_height_log2);

  // In case of loopfilter row-multithreading, the worker on an SB row waits for
  // the vertical edge filtering of the right and top-right SBs. Hence, in case
  // a thread (main/worker) encounters an error, update that vertical
  // loopfiltering of every SB row in the frame is complete in order to avoid
  // dependent workers waiting indefinitely.
  for (sb_row = 0; sb_row < sb_rows; ++sb_row)
    for (plane = 0; plane < MAX_MB_PLANE; ++plane)
      sync_write(lf_sync, sb_row, sb_cols - 1, sb_cols, plane);
}